

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O3

u8string *
jessilib::io::process_message<jessilib::io::ansi::text_wrapper>
          (u8string *__return_storage_ptr__,formatted_message *msg)

{
  pointer ptVar1;
  basic_string_view<char8_t> format_str;
  text *text;
  pointer ptVar2;
  basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
  args_00;
  vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
  args;
  basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
  arg;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
  local_78;
  iterator iStack_70;
  basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
  *local_68;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *local_60;
  undefined1 local_58 [16];
  type local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  
  local_78.values_ =
       (value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
        *)0x0;
  iStack_70._M_current =
       (basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
        *)0x0;
  local_68 = (basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
              *)0x0;
  ptVar2 = (msg->m_message).
           super__Vector_base<jessilib::io::text,_std::allocator<jessilib::io::text>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar1 = (msg->m_message).
           super__Vector_base<jessilib::io::text,_std::allocator<jessilib::io::text>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (ptVar2 != ptVar1) {
    local_60 = __return_storage_ptr__;
    do {
      local_48 = custom_type;
      local_58._8_8_ =
           fmt::v8::detail::
           value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>
           ::
           format_custom_arg<jessilib::io::ansi::text_wrapper,fmt::v8::formatter<jessilib::io::ansi::text_wrapper,char8_t,void>>
      ;
      local_58._0_8_ = ptVar2;
      if (iStack_70._M_current == local_68) {
        std::
        vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>,std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>>>
        ::
        _M_realloc_insert<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>>
                  ((vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>,std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>>>
                    *)&local_78,iStack_70,
                   (basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
                    *)local_58);
      }
      else {
        *(ulong *)&(iStack_70._M_current)->type_ = CONCAT44(uStack_44,0xf);
        *(undefined8 *)&(iStack_70._M_current)->field_0x18 = uStack_40;
        ((iStack_70._M_current)->value_).field_0.long_long_value = (longlong)ptVar2;
        ((iStack_70._M_current)->value_).field_0.custom.format =
             fmt::v8::detail::
             value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>
             ::
             format_custom_arg<jessilib::io::ansi::text_wrapper,fmt::v8::formatter<jessilib::io::ansi::text_wrapper,char8_t,void>>
        ;
        iStack_70._M_current = iStack_70._M_current + 1;
      }
      ptVar2 = ptVar2 + 1;
      __return_storage_ptr__ = local_60;
    } while (ptVar2 != ptVar1);
  }
  if (((ulong)((long)iStack_70._M_current - (long)local_78) >> 0x24 & 1) != 0) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  }
  args_00.desc_ =
       (ulong)((uint)((ulong)((long)iStack_70._M_current - (long)local_78) >> 5) & 0x7fffffff) |
       0x8000000000000000;
  format_str.data_ = (msg->m_format)._M_dataplus._M_p;
  format_str.size_ = (msg->m_format)._M_string_length;
  args_00.field_1.values_ = local_78.values_;
  fmt::v8::vformat<char8_t,_0>(__return_storage_ptr__,format_str,args_00);
  if (local_78.values_ !=
      (value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
       *)0x0) {
    operator_delete(local_78.values_,(long)local_68 - (long)local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::u8string process_message(const jessilib::io::formatted_message& msg) {
	using FormatCharT = char8_t;
	using format_args_type = fmt::basic_format_args<fmt::buffer_context<FormatCharT>>;
	using format_arg_type = format_args_type::format_arg;
	using format_context_type = fmt::buffer_context<FormatCharT>;
	using string_view_type = fmt::v8::basic_string_view<FormatCharT>;

	// Populate args
	std::vector<format_arg_type> args;
	for (auto& text : msg.get_message()) {
		args.emplace_back(fmt::detail::make_arg<format_context_type>(wrap_text<WrapperT>(text)));
	}

	// Pass args into vformat
	format_args_type text_args{ args.data(), static_cast<int>(args.size()) };
	string_view_type fmt_view{ msg.format().data(), msg.format().size() };
	return fmt::vformat(fmt_view, text_args);
}